

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_convolver_tests.cpp
# Opt level: O2

void __thiscall ConvolutionTest::run_real_convolve(ConvolutionTest *this,Context *ctx)

{
  anon_enum_32 aVar1;
  uint uVar2;
  pointer pMVar3;
  pointer piVar4;
  unique_ptr<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
  uVar5;
  element_type *in;
  bool bVar6;
  size_t sVar7;
  BlockConvolver *this_00;
  int *piVar8;
  long lVar9;
  size_t block;
  ulong uVar10;
  unique_ptr<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
  convolver;
  Scalar local_13c;
  DenseBase<Eigen::Matrix<float,_1,1,0,_1,1>> *local_138;
  DenseBase<Eigen::Matrix<float,_1,1,0,_1,1>> *local_130;
  vector<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
  filters;
  type local_108;
  ArithmeticSequence<long,_long,_Eigen::internal::FixedInt<1>_> block_sel;
  type local_b8;
  Filter filter;
  
  filters.
  super__Vector_base<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  filters.
  super__Vector_base<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  filters.
  super__Vector_base<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar9 = 8;
  for (uVar10 = 0;
      pMVar3 = (this->irs).
               super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar10 < (ulong)((long)(this->irs).
                             super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar3 >> 4);
      uVar10 = uVar10 + 1) {
    ear::dsp::block_convolver::Filter::Filter
              (&filter,ctx,
               *(size_t *)
                ((long)&(pMVar3->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data + lVar9),*(real_t **)((long)pMVar3 + lVar9 + -8));
    sVar7 = ear::dsp::block_convolver::Filter::num_blocks(&filter);
    if (this->max_num_blocks < sVar7) {
      sVar7 = ear::dsp::block_convolver::Filter::num_blocks(&filter);
      this->max_num_blocks = sVar7;
    }
    std::
    vector<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>::
    emplace_back<ear::dsp::block_convolver::Filter>(&filters,&filter);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&filter.impl.
                super___shared_ptr<ear::dsp::block_convolver_impl::Filter,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    lVar9 = lVar9 + 0x10;
  }
  convolver._M_t.
  super___uniq_ptr_impl<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
  ._M_t.
  super__Tuple_impl<0UL,_ear::dsp::block_convolver::BlockConvolver_*,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
  .super__Head_base<0UL,_ear::dsp::block_convolver::BlockConvolver_*,_false>._M_head_impl =
       (__uniq_ptr_data<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>,_true,_true>
        )(__uniq_ptr_impl<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
          )0x0;
  aVar1 = this->constructor;
  if (aVar1 == NO_FILTER) {
    this_00 = (BlockConvolver *)operator_new(8);
    ear::dsp::block_convolver::BlockConvolver::BlockConvolver(this_00,ctx,this->max_num_blocks);
  }
  else if (aVar1 == WITH_FILTER_NUM_BLOCKS) {
    this_00 = (BlockConvolver *)operator_new(8);
    ear::dsp::block_convolver::BlockConvolver::BlockConvolver
              (this_00,ctx,
               filters.
               super__Vector_base<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
               ._M_impl.super__Vector_impl_data._M_start + this->initial_ir,this->max_num_blocks);
  }
  else {
    if (aVar1 != WITH_FILTER_NO_NUM_BLOCKS) goto LAB_00116416;
    this_00 = (BlockConvolver *)operator_new(8);
    ear::dsp::block_convolver::BlockConvolver::BlockConvolver
              (this_00,ctx,
               filters.
               super__Vector_base<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
               ._M_impl.super__Vector_impl_data._M_start + this->initial_ir,0);
  }
  std::
  __uniq_ptr_impl<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
  ::reset((__uniq_ptr_impl<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
           *)&convolver,this_00);
LAB_00116416:
  Eigen::internal::is_malloc_allowed_impl(bool,bool)::value = 0;
  if (-1 < (long)this->initial_ir) {
    ear::dsp::block_convolver::BlockConvolver::set_filter
              ((BlockConvolver *)
               convolver._M_t.
               super___uniq_ptr_impl<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
               ._M_t.
               super__Tuple_impl<0UL,_ear::dsp::block_convolver::BlockConvolver_*,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
               .super__Head_base<0UL,_ear::dsp::block_convolver::BlockConvolver_*,_false>.
               _M_head_impl,
               filters.
               super__Vector_base<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
               ._M_impl.super__Vector_impl_data._M_start + this->initial_ir);
  }
  local_130 = (DenseBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&this->input;
  local_138 = (DenseBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&this->real_output;
  lVar9 = -4;
  uVar10 = 0;
  do {
    if (this->num_blocks <= uVar10) {
      Eigen::internal::is_malloc_allowed_impl(bool,bool)::value = 1;
      std::
      unique_ptr<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
      ::~unique_ptr(&convolver);
      std::
      vector<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
      ::~vector(&filters);
      return;
    }
    block_sel.m_size = this->block_size;
    block_sel.m_first = block_sel.m_size * uVar10;
    piVar4 = (this->ir_for_block).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = *(uint *)((long)piVar4 + lVar9 + 4);
    piVar8 = (int *)((long)piVar4 + lVar9);
    if (uVar10 == 0) {
      piVar8 = &this->initial_ir;
    }
    if (*piVar8 != uVar2) {
      if ((int)uVar2 < 0) {
        ear::dsp::block_convolver::BlockConvolver::fade_down
                  ((BlockConvolver *)
                   convolver._M_t.
                   super___uniq_ptr_impl<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ear::dsp::block_convolver::BlockConvolver_*,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
                   .super__Head_base<0UL,_ear::dsp::block_convolver::BlockConvolver_*,_false>.
                   _M_head_impl);
      }
      else {
        ear::dsp::block_convolver::BlockConvolver::crossfade_filter
                  ((BlockConvolver *)
                   convolver._M_t.
                   super___uniq_ptr_impl<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ear::dsp::block_convolver::BlockConvolver_*,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
                   .super__Head_base<0UL,_ear::dsp::block_convolver::BlockConvolver_*,_false>.
                   _M_head_impl,
                   filters.
                   super__Vector_base<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar2);
      }
    }
    if (this->null_for_zeros == true) {
      Eigen::DenseBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator()(&local_b8,local_130,&block_sel)
      ;
      local_108.super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>.
      super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_outerStride
           = local_b8.super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>.
             super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
             m_outerStride;
      local_108.super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>.
      super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_startRow.
      m_value = local_b8.super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>.
                super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                m_startRow.m_value;
      local_108.super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>.
      super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>._40_8_ =
           local_b8.super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>.
           super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>._40_8_;
      local_108.super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>.
      super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>._16_8_ =
           local_b8.super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>.
           super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
           _16_8_;
      local_108.super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>.
      super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_xpr =
           local_b8.super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>.
           super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_xpr;
      local_108.super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>.
      super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_data =
           local_b8.super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>.
           super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
           m_data;
      local_108.super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>.
      super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_rows.
      m_value = local_b8.super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>.
                super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
                super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
                m_rows.m_value;
      local_13c = 0.0;
      Eigen::
      ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>_>
      ::operator==((CmpEQReturnType *)&filter,
                   (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>_>_>
                    *)&local_108,&local_13c);
      bVar6 = Eigen::
              DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)0>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Array<float,_-1,_1,_0,_-1,_1>_>_>_>
              ::all((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)0>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>
                     *)&filter);
      uVar5 = convolver;
      if (!bVar6) goto LAB_00116578;
      Eigen::DenseBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator()
                ((type *)&filter,local_138,&block_sel);
      ear::dsp::block_convolver::BlockConvolver::process
                ((BlockConvolver *)
                 uVar5._M_t.
                 super___uniq_ptr_impl<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_ear::dsp::block_convolver::BlockConvolver_*,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
                 .super__Head_base<0UL,_ear::dsp::block_convolver::BlockConvolver_*,_false>.
                 _M_head_impl,(float *)0x0,
                 (float *)filter.impl.
                          super___shared_ptr<ear::dsp::block_convolver_impl::Filter,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr);
    }
    else {
LAB_00116578:
      uVar5._M_t.
      super___uniq_ptr_impl<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
      ._M_t.
      super__Tuple_impl<0UL,_ear::dsp::block_convolver::BlockConvolver_*,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
      .super__Head_base<0UL,_ear::dsp::block_convolver::BlockConvolver_*,_false>._M_head_impl =
           convolver._M_t.
           super___uniq_ptr_impl<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
           ._M_t.
           super__Tuple_impl<0UL,_ear::dsp::block_convolver::BlockConvolver_*,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
           .super__Head_base<0UL,_ear::dsp::block_convolver::BlockConvolver_*,_false>._M_head_impl;
      Eigen::DenseBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator()
                ((type *)&filter,local_130,&block_sel);
      in = filter.impl.
           super___shared_ptr<ear::dsp::block_convolver_impl::Filter,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      Eigen::DenseBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator()
                (&local_108,local_138,&block_sel);
      ear::dsp::block_convolver::BlockConvolver::process
                ((BlockConvolver *)
                 uVar5._M_t.
                 super___uniq_ptr_impl<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_ear::dsp::block_convolver::BlockConvolver_*,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
                 .super__Head_base<0UL,_ear::dsp::block_convolver::BlockConvolver_*,_false>.
                 _M_head_impl,(float *)in,
                 local_108.super_Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>.
                 super_BlockImpl<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
                 super_BlockImpl_dense<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
                 super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                 .m_data);
    }
    uVar10 = uVar10 + 1;
    lVar9 = lVar9 + 4;
  } while( true );
}

Assistant:

void run_real_convolve(const Context &ctx) {
    // Create filters from irs, while finding the required number of blocks.
    std::vector<Filter> filters;
    for (size_t i = 0; i < irs.size(); i++) {
      Filter filter(ctx, irs[i].rows(), irs[i].data());
      if (filter.num_blocks() > max_num_blocks)
        max_num_blocks = filter.num_blocks();
      filters.push_back(std::move(filter));
    }

    std::unique_ptr<BlockConvolver> convolver;

    // Create the filter
    switch (constructor) {
      case NO_FILTER:
        convolver.reset(new BlockConvolver(ctx, max_num_blocks));
        break;
      case WITH_FILTER_NUM_BLOCKS:
        convolver.reset(
            new BlockConvolver(ctx, filters[initial_ir], max_num_blocks));
        break;
      case WITH_FILTER_NO_NUM_BLOCKS:
        convolver.reset(new BlockConvolver(ctx, filters[initial_ir]));
        break;
    }

    Eigen::internal::set_is_malloc_allowed(false);

    // don't set the starting filter if initial_ir is invalid
    if (initial_ir >= 0) {
      convolver->set_filter(filters[initial_ir]);
    }

    // filter each block
    for (size_t block = 0; block < num_blocks; block++) {
      const size_t offset = block_size * block;
      auto block_sel = Eigen::seqN(offset, block_size);

      // crossfade if the filter has changed
      int this_filter = ir_for_block[block];
      int last_filter = block == 0 ? initial_ir : ir_for_block[block - 1];
      if (last_filter != this_filter) {
        if (this_filter >= 0)
          convolver->crossfade_filter(filters[this_filter]);
        else
          convolver->fade_down();
      }

      // filter the block to the output; possibly passing null if zeros are
      // detected
      if (null_for_zeros && (input(block_sel).array() == 0.0).all()) {
        convolver->process(nullptr, real_output(block_sel).data());
      } else {
        convolver->process(input(block_sel).data(),
                           real_output(block_sel).data());
      }
    }
    Eigen::internal::set_is_malloc_allowed(true);
  }